

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O0

char * cmTargetPropertyComputer::GetLocation<cmGeneratorTarget>
                 (cmGeneratorTarget *tgt,string *prop,cmMessenger *messenger,
                 cmListFileBacktrace *context)

{
  __type _Var1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  string *psVar7;
  allocator local_99;
  undefined1 local_98 [8];
  string configName_1;
  string local_70;
  char *local_50;
  char *configName;
  allocator local_31;
  cmListFileBacktrace *local_30;
  cmListFileBacktrace *context_local;
  cmMessenger *messenger_local;
  string *prop_local;
  cmGeneratorTarget *tgt_local;
  
  local_30 = context;
  context_local = (cmListFileBacktrace *)messenger;
  messenger_local = (cmMessenger *)prop;
  prop_local = (string *)tgt;
  TVar3 = cmGeneratorTarget::GetType(tgt);
  if ((((TVar3 != EXECUTABLE) &&
       (TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)prop_local), TVar3 != STATIC_LIBRARY
       )) && (TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)prop_local),
             TVar3 != SHARED_LIBRARY)) &&
     ((TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)prop_local), TVar3 != MODULE_LIBRARY
      && (TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)prop_local),
         TVar3 != UNKNOWN_LIBRARY)))) {
    return (char *)0x0;
  }
  if ((GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
       ::propLOCATION_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                                   ::propLOCATION_abi_cxx11_), iVar4 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                ::propLOCATION_abi_cxx11_,"LOCATION",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                  ::propLOCATION_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                         ::propLOCATION_abi_cxx11_);
  }
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          messenger_local,
                          &GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                           ::propLOCATION_abi_cxx11_);
  if (_Var1) {
    bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)prop_local);
    if (!bVar2) {
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
      bVar2 = HandleLocationPropertyPolicy(psVar7,(cmMessenger *)context_local,local_30);
      if (!bVar2) {
        return (char *)0x0;
      }
    }
    pcVar5 = ComputeLocationForBuild<cmGeneratorTarget>((cmGeneratorTarget *)prop_local);
    return pcVar5;
  }
  bVar2 = cmHasLiteralPrefix<std::__cxx11::string,10ul>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     messenger_local,(char (*) [10])"LOCATION_");
  if (bVar2) {
    bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)prop_local);
    if (!bVar2) {
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
      bVar2 = HandleLocationPropertyPolicy(psVar7,(cmMessenger *)context_local,local_30);
      if (!bVar2) {
        return (char *)0x0;
      }
    }
    lVar6 = std::__cxx11::string::c_str();
    psVar7 = prop_local;
    local_50 = (char *)(lVar6 + 9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,(char *)(lVar6 + 9),
               (allocator *)(configName_1.field_2._M_local_buf + 0xf));
    tgt_local = (cmGeneratorTarget *)
                ComputeLocation<cmGeneratorTarget>((cmGeneratorTarget *)psVar7,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)(configName_1.field_2._M_local_buf + 0xf));
    return (char *)tgt_local;
  }
  bVar2 = cmHasLiteralSuffix<std::__cxx11::string,10ul>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     messenger_local,(char (*) [10])0xa322f9);
  if (!bVar2) {
    return (char *)0x0;
  }
  bVar2 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     messenger_local,(char (*) [17])"XCODE_ATTRIBUTE_");
  if (bVar2) {
    return (char *)0x0;
  }
  pcVar5 = (char *)std::__cxx11::string::c_str();
  lVar6 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_98,pcVar5,lVar6 - 9,&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98,"IMPORTED");
  if (bVar2) {
    bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)prop_local);
    if (!bVar2) {
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
      bVar2 = HandleLocationPropertyPolicy(psVar7,(cmMessenger *)context_local,local_30);
      if (!bVar2) {
        tgt_local = (cmGeneratorTarget *)0x0;
        bVar2 = true;
        goto LAB_0075e09c;
      }
    }
    tgt_local = (cmGeneratorTarget *)
                ComputeLocation<cmGeneratorTarget>
                          ((cmGeneratorTarget *)prop_local,(string *)local_98);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
LAB_0075e09c:
  std::__cxx11::string::~string((string *)local_98);
  if (!bVar2) {
    return (char *)0x0;
  }
  return (char *)tgt_local;
}

Assistant:

static const char* GetLocation(Target const* tgt, std::string const& prop,
                                 cmMessenger* messenger,
                                 cmListFileBacktrace const& context)

  {
    // Watch for special "computed" properties that are dependent on
    // other properties or variables.  Always recompute them.
    if (tgt->GetType() == cmStateEnums::EXECUTABLE ||
        tgt->GetType() == cmStateEnums::STATIC_LIBRARY ||
        tgt->GetType() == cmStateEnums::SHARED_LIBRARY ||
        tgt->GetType() == cmStateEnums::MODULE_LIBRARY ||
        tgt->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
      static const std::string propLOCATION = "LOCATION";
      if (prop == propLOCATION) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                          context)) {
          return CM_NULLPTR;
        }
        return ComputeLocationForBuild(tgt);
      }

      // Support "LOCATION_<CONFIG>".
      if (cmHasLiteralPrefix(prop, "LOCATION_")) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                          context)) {
          return CM_NULLPTR;
        }
        const char* configName = prop.c_str() + 9;
        return ComputeLocation(tgt, configName);
      }

      // Support "<CONFIG>_LOCATION".
      if (cmHasLiteralSuffix(prop, "_LOCATION") &&
          !cmHasLiteralPrefix(prop, "XCODE_ATTRIBUTE_")) {
        std::string configName(prop.c_str(), prop.size() - 9);
        if (configName != "IMPORTED") {
          if (!tgt->IsImported() &&
              !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                            context)) {
            return CM_NULLPTR;
          }
          return ComputeLocation(tgt, configName);
        }
      }
    }
    return CM_NULLPTR;
  }